

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlFreeCatalogEntry(void *payload,xmlChar *name)

{
  if ((payload != (void *)0x0) && (*(int *)((long)payload + 0x3c) != 1)) {
    if (xmlDebugCatalogs != 0) {
      if ((*(long *)((long)payload + 0x20) == 0) && (*(long *)((long)payload + 0x28) == 0)) {
        xmlCatalogPrintDebug("Free catalog entry\n");
      }
      else {
        xmlCatalogPrintDebug("Free catalog entry %s\n");
      }
    }
    if (*(void **)((long)payload + 0x20) != (void *)0x0) {
      (*xmlFree)(*(void **)((long)payload + 0x20));
    }
    if (*(void **)((long)payload + 0x28) != (void *)0x0) {
      (*xmlFree)(*(void **)((long)payload + 0x28));
    }
    if (*(void **)((long)payload + 0x30) != (void *)0x0) {
      (*xmlFree)(*(void **)((long)payload + 0x30));
    }
    (*xmlFree)(payload);
    return;
  }
  return;
}

Assistant:

static void
xmlFreeCatalogEntry(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr ret = (xmlCatalogEntryPtr) payload;
    if (ret == NULL)
	return;
    /*
     * Entries stored in the file hash must be deallocated
     * only by the file hash cleaner !
     */
    if (ret->dealloc == 1)
	return;

    if (xmlDebugCatalogs) {
	if (ret->name != NULL)
	    xmlCatalogPrintDebug(
		    "Free catalog entry %s\n", ret->name);
	else if (ret->value != NULL)
	    xmlCatalogPrintDebug(
		    "Free catalog entry %s\n", ret->value);
	else
	    xmlCatalogPrintDebug(
		    "Free catalog entry\n");
    }

    if (ret->name != NULL)
	xmlFree(ret->name);
    if (ret->value != NULL)
	xmlFree(ret->value);
    if (ret->URL != NULL)
	xmlFree(ret->URL);
    xmlFree(ret);
}